

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

SchemaCatalogEntry * __thiscall
duckdb::Catalog::GetSchema(Catalog *this,ClientContext *context,string *schema)

{
  int iVar1;
  undefined4 extraout_var;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_68;
  EntryLookupInfo local_60;
  CatalogTransaction local_40;
  
  CatalogTransaction::CatalogTransaction(&local_40,this,context);
  EntryLookupInfo::EntryLookupInfo
            (&local_60,SCHEMA_ENTRY,schema,(QueryErrorContext)0xffffffffffffffff);
  iVar1 = (*this->_vptr_Catalog[8])(this,&local_60,0);
  local_68.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar1);
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_68);
  return local_68.ptr;
}

Assistant:

SchemaCatalogEntry &Catalog::GetSchema(ClientContext &context, const string &schema) {
	return GetSchema(GetCatalogTransaction(context), schema);
}